

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# skiplist.h
# Opt level: O0

Node * __thiscall
leveldb::SkipList<const_char_*,_leveldb::MemTable::KeyComparator>::FindLessThan
          (SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *this,char **key)

{
  int iVar1;
  Node *pNVar2;
  char *in_RSI;
  Node *in_RDI;
  KeyComparator *unaff_retaddr;
  Node *next;
  int level;
  Node *x;
  int in_stack_ffffffffffffffcc;
  SkipList<const_char_*,_leveldb::MemTable::KeyComparator> *in_stack_ffffffffffffffd8;
  int local_1c;
  Node *local_18;
  Node *aptr;
  
  pNVar2 = in_RDI[1].next_[0]._M_b._M_p;
  aptr = in_RDI;
  local_1c = GetMaxHeight(in_stack_ffffffffffffffd8);
  local_1c = local_1c + -1;
LAB_0011a1ad:
  local_18 = pNVar2;
  pNVar2 = Node::Next(in_RDI,in_stack_ffffffffffffffcc);
  if (pNVar2 != (Node *)0x0) goto code_r0x0011a1c8;
  goto LAB_0011a1e7;
code_r0x0011a1c8:
  iVar1 = MemTable::KeyComparator::operator()(unaff_retaddr,(char *)aptr,in_RSI);
  if (-1 < iVar1) {
LAB_0011a1e7:
    if (local_1c == 0) {
      return local_18;
    }
    local_1c = local_1c + -1;
    pNVar2 = local_18;
  }
  goto LAB_0011a1ad;
}

Assistant:

typename SkipList<Key, Comparator>::Node*
SkipList<Key, Comparator>::FindLessThan(const Key& key) const {
  Node* x = head_;
  int level = GetMaxHeight() - 1;
  while (true) {
    assert(x == head_ || compare_(x->key, key) < 0);
    Node* next = x->Next(level);
    if (next == nullptr || compare_(next->key, key) >= 0) {
      if (level == 0) {
        return x;
      } else {
        // Switch to next list
        level--;
      }
    } else {
      x = next;
    }
  }
}